

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

size_t ecHasOrderA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t m)

{
  size_t sVar1;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  sVar1 = ecMulA_deep(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return in_RSI * in_RDI * 8 + sVar1;
}

Assistant:

size_t ecHasOrderA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t m)
{
	return O_OF_W(ec_d * n) + ecMulA_deep(n, ec_d, ec_deep, m);
}